

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deBool deSocket_listen(deSocket *sock,deSocketAddress *address)

{
  ushort uVar1;
  deBool dVar2;
  int iVar3;
  int __protocol;
  undefined4 local_58;
  socklen_t local_54;
  int reuseVal;
  NativeSocklen bsdAddrLen;
  sockaddr *bsdAddr;
  deUint8 bsdAddrBuf [28];
  int backlogSize;
  deSocketAddress *address_local;
  deSocket *sock_local;
  
  _reuseVal = (sockaddr *)&bsdAddr;
  if (sock->state == DE_SOCKETSTATE_CLOSED) {
    dVar2 = deSocketAddressToBsdAddress(address,0x1c,_reuseVal,&local_54);
    if (dVar2 == 0) {
      sock_local._4_4_ = 0;
    }
    else {
      uVar1 = _reuseVal->sa_family;
      iVar3 = deSocketTypeToBsdType(address->type);
      __protocol = deSocketProtocolToBsdProtocol(address->protocol);
      iVar3 = socket((uint)uVar1,iVar3,__protocol);
      sock->handle = iVar3;
      dVar2 = deSocketHandleIsValid(sock->handle);
      if (dVar2 == 0) {
        sock_local._4_4_ = 0;
      }
      else {
        sock->state = DE_SOCKETSTATE_DISCONNECTED;
        local_58 = 1;
        setsockopt(sock->handle,1,2,&local_58,4);
        iVar3 = bind(sock->handle,(sockaddr *)_reuseVal,local_54);
        if (iVar3 == 0) {
          iVar3 = listen(sock->handle,4);
          if (iVar3 == 0) {
            sock->state = DE_SOCKETSTATE_LISTENING;
            sock_local._4_4_ = 1;
          }
          else {
            deSocket_close(sock);
            sock_local._4_4_ = 0;
          }
        }
        else {
          deSocket_close(sock);
          sock_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    sock_local._4_4_ = 0;
  }
  return sock_local._4_4_;
}

Assistant:

deBool deSocket_listen (deSocket* sock, const deSocketAddress* address)
{
	const int			backlogSize	= 4;
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen;

	if (sock->state != DE_SOCKETSTATE_CLOSED)
		return DE_FALSE;

	/* Resolve address. */
	if (!deSocketAddressToBsdAddress(address, sizeof(bsdAddrBuf), bsdAddr, &bsdAddrLen))
		return DE_FALSE;

	/* Create socket. */
	sock->handle = socket(bsdAddr->sa_family, deSocketTypeToBsdType(address->type), deSocketProtocolToBsdProtocol(address->protocol));
	if (!deSocketHandleIsValid(sock->handle))
		return DE_FALSE;

	sock->state = DE_SOCKETSTATE_DISCONNECTED;

	/* Allow re-using address. */
	{
		int reuseVal = 1;
		setsockopt(sock->handle, SOL_SOCKET, SO_REUSEADDR, (const char*)&reuseVal, (int)sizeof(reuseVal));
	}

	/* Bind to address. */
	if (bind(sock->handle, bsdAddr, (NativeSocklen)bsdAddrLen) != 0)
	{
		deSocket_close(sock);
		return DE_FALSE;
	}

	/* Start listening. */
	if (listen(sock->handle, backlogSize) != 0)
	{
		deSocket_close(sock);
		return DE_FALSE;
	}

	sock->state = DE_SOCKETSTATE_LISTENING;

	return DE_TRUE;
}